

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O1

void amrex::MLLinOp::makeConsolidatedDMap
               (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *ba,
               Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *dm,
               int ratio,int strategy)

{
  pointer pDVar1;
  long *plVar2;
  int *piVar3;
  pointer piVar4;
  Vector<int,_std::allocator<int>_> *pVVar5;
  div_t dVar6;
  int *piVar7;
  ulong uVar8;
  uint uVar9;
  int *x_1;
  pointer piVar10;
  ulong uVar11;
  double dVar12;
  Vector<int,_std::allocator<int>_> pmap;
  Vector<int,_std::allocator<int>_> pmap_g;
  allocator_type local_89;
  vector<int,_std::allocator<int>_> local_88;
  int local_70;
  int local_6c;
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *local_68;
  long local_60;
  vector<int,_std::allocator<int>_> local_58;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *local_40;
  ulong local_38;
  
  uVar9 = (int)((long)(ba->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(ba->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x3b13b13b;
  if (1 < (int)uVar9) {
    uVar8 = (ulong)(uVar9 & 0x7fffffff);
    local_70 = 1;
    uVar11 = 1;
    local_6c = strategy;
    local_68 = dm;
    local_40 = ba;
    local_38 = uVar8;
    do {
      pDVar1 = (dm->
               super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
               ).
               super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_60 = uVar11 * 0x10;
      plVar2 = *(long **)&pDVar1[uVar11].m_ref.
                          super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
      ;
      if (*plVar2 == plVar2[1]) {
        uVar9 = *(uint *)(DAT_00756620 + -0x38);
        pVVar5 = DistributionMapping::ProcessorMap(pDVar1 + (uVar11 - 1));
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_88,
                   (long)(pVVar5->super_vector<int,_std::allocator<int>_>).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pVVar5->super_vector<int,_std::allocator<int>_>).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_58);
        ParallelContext::Frame::global_to_local_rank
                  ((Frame *)(DAT_00756620 + -0x48),
                   local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (pVVar5->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start,(long)(int)((ulong)((long)local_88.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                               (long)local_88.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 2));
        local_70 = local_70 * ratio;
        if (strategy == 3) {
          piVar7 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (local_70 == ratio) {
            DistributionMapping::makeSFC
                      ((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)&local_58,
                       (local_40->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl
                       .super__Vector_impl_data._M_start + uVar11,true,
                       *(int *)(DAT_00756620 + -0x38));
            if (0 < (int)uVar9) {
              uVar8 = 0;
              do {
                piVar3 = *(int **)(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + uVar8 * 6 + 2);
                for (piVar7 = *(int **)(local_58.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start + uVar8 * 6);
                    piVar7 != piVar3; piVar7 = piVar7 + 1) {
                  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[*piVar7] = (int)uVar8;
                }
                uVar8 = uVar8 + 1;
              } while (uVar8 != uVar9);
            }
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       *)&local_58);
            piVar7 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          }
          for (; piVar7 != local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish; piVar7 = piVar7 + 1) {
            *piVar7 = *piVar7 / ratio;
          }
        }
        else if (strategy == 2) {
          dVar12 = ceil((double)(int)uVar9 / (double)local_70);
          piVar4 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start !=
              local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish) {
            piVar10 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            do {
              dVar6 = div(*piVar10,(int)dVar12);
              *piVar10 = dVar6.rem;
              piVar10 = piVar10 + 1;
            } while (piVar10 != piVar4);
          }
        }
        else {
          piVar7 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (strategy == 1) {
            for (; piVar7 != local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish; piVar7 = piVar7 + 1) {
              *piVar7 = *piVar7 / ratio;
            }
          }
        }
        dm = local_68;
        if (*(int *)(DAT_00756620 + -0x48) == ParallelDescriptor::m_comm) {
          DistributionMapping::define
                    ((DistributionMapping *)
                     ((long)&(((local_68->
                               super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                               ).
                               super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                     + local_60),(Vector<int,_std::allocator<int>_> *)&local_88);
        }
        else {
          std::vector<int,_std::allocator<int>_>::vector
                    (&local_58,
                     (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2,&local_89);
          dm = local_68;
          ParallelContext::Frame::local_to_global_rank
                    ((Frame *)(DAT_00756620 + -0x48),
                     local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (long)(int)((ulong)((long)local_88.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_finish -
                                        (long)local_88.super__Vector_base<int,_std::allocator<int>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 2));
          DistributionMapping::define
                    ((DistributionMapping *)
                     ((long)&(((dm->
                               super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                               ).
                               super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                     + local_60),(Vector<int,_std::allocator<int>_> *)&local_58);
          if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (int *)0x0) {
            operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
        }
        uVar8 = local_38;
        strategy = local_6c;
        if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) {
          operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
          uVar8 = local_38;
          strategy = local_6c;
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar8);
  }
  return;
}

Assistant:

void
MLLinOp::makeConsolidatedDMap (const Vector<BoxArray>& ba, Vector<DistributionMapping>& dm,
                               int ratio, int strategy)
{
    BL_PROFILE("MLLinOp::makeConsolidatedDMap()");

    int factor = 1;
    BL_ASSERT(!dm[0].empty());
    for (int i = 1, N=ba.size(); i < N; ++i)
    {
        if (dm[i].empty())
        {
            factor *= ratio;

            const int nprocs = ParallelContext::NProcsSub();
            const auto& pmap_fine = dm[i-1].ProcessorMap();
            Vector<int> pmap(pmap_fine.size());
            ParallelContext::global_to_local_rank(pmap.data(), pmap_fine.data(), pmap.size());
            if (strategy == 1) {
                for (auto& x: pmap) {
                    x /= ratio;
                }
            } else if (strategy == 2) {
                int nprocs_con = static_cast<int>(std::ceil(static_cast<Real>(nprocs)
                                                            / static_cast<Real>(factor)));
                for (auto& x: pmap) {
                    auto d = std::div(x,nprocs_con);
                    x = d.rem;
                }
            } else if (strategy == 3) {
                if (factor == ratio) {
                    const std::vector< std::vector<int> >& sfc = DistributionMapping::makeSFC(ba[i]);
                    for (int iproc = 0; iproc < nprocs; ++iproc) {
                        for (int ibox : sfc[iproc]) {
                            pmap[ibox] = iproc;
                        }
                    }
                }
                for (auto& x: pmap) {
                    x /= ratio;
                }
            }

            if (ParallelContext::CommunicatorSub() == ParallelDescriptor::Communicator()) {
                dm[i].define(std::move(pmap));
            } else {
                Vector<int> pmap_g(pmap.size());
                ParallelContext::local_to_global_rank(pmap_g.data(), pmap.data(), pmap.size());
                dm[i].define(std::move(pmap_g));
            }
        }
    }
}